

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_value<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_type *pvVar2;
  error_type *this;
  error_info *v;
  _Alloc_hider _Var3;
  source_location src;
  result<toml::value_t,_toml::error_info> ty_res;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  source_location local_368;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [40];
  _Alloc_hider local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8 [2];
  source_location local_288;
  source_location local_208;
  result<toml::value_t,_toml::error_info> local_190;
  failure<toml::error_info> local_130;
  failure<toml::error_info> local_d8;
  failure<toml::error_info> local_80;
  
  guess_value_type<toml::type_config>(&local_190,loc,ctx);
  if (local_190.is_ok_ == false) {
    this = result<toml::value_t,_toml::error_info>::unwrap_err(&local_190,(source_location)0x4effa8)
    ;
    err<toml::error_info_const&>(&local_130,(toml *)this,v);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_130);
    failure<toml::error_info>::~failure(&local_130);
    goto LAB_00377040;
  }
  pvVar2 = result<toml::value_t,_toml::error_info>::unwrap(&local_190,(source_location)0x4effc0);
  switch(*pvVar2) {
  case empty:
    if ((ctx->toml_spec_).ext_null_value == true) {
      parse_null<toml::type_config>(__return_storage_ptr__,loc,ctx);
      break;
    }
    region::region((region *)local_2f0,loc);
    source_location::source_location(&local_368,(region *)local_2f0);
    region::~region((region *)local_2f0);
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_388,"toml::parse_value: unknown value appeared","");
    paVar1 = &local_368.file_name_.field_2;
    local_208.file_name_._M_dataplus._M_p = (pointer)&local_208.file_name_.field_2;
    local_208.last_offset_._0_4_ = (undefined4)local_368.last_offset_;
    local_208.last_offset_._4_4_ = local_368.last_offset_._4_4_;
    local_208.length_._0_4_ = (undefined4)local_368.length_;
    local_208.length_._4_4_ = local_368.length_._4_4_;
    local_208.last_line_._0_4_ = (undefined4)local_368.last_line_;
    local_208.last_line_._4_4_ = local_368.last_line_._4_4_;
    local_208.last_column_._0_4_ = (undefined4)local_368.last_column_;
    local_208.last_column_._4_4_ = local_368.last_column_._4_4_;
    local_208.first_column_._0_4_ = (undefined4)local_368.first_column_;
    local_208.first_column_._4_4_ = local_368.first_column_._4_4_;
    local_208.first_offset_._0_4_ = (undefined4)local_368.first_offset_;
    local_208.first_offset_._4_4_ = local_368.first_offset_._4_4_;
    local_208.is_ok_ = local_368.is_ok_;
    local_208._1_7_ = local_368._1_7_;
    local_208.first_line_ = local_368.first_line_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.file_name_._M_dataplus._M_p == paVar1) {
      local_208.file_name_.field_2._8_8_ = local_368.file_name_.field_2._8_8_;
    }
    else {
      local_208.file_name_._M_dataplus._M_p = local_368.file_name_._M_dataplus._M_p;
    }
    local_208.file_name_._M_string_length = local_368.file_name_._M_string_length;
    local_368.file_name_._M_string_length = 0;
    local_368.file_name_.field_2._M_local_buf[0] = '\0';
    local_208.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_368.line_str_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_208.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_368.line_str_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_208.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_368.line_str_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_368.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    local_368.file_name_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"here","");
    make_error_info<>((error_info *)local_2f0,&local_388,&local_208,&local_3a8);
    err<toml::error_info>(&local_80,(error_info *)local_2f0);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_80);
    failure<toml::error_info>::~failure(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_p != local_2a8) {
      operator_delete(local_2b8._M_p,local_2a8[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_2e0 + 0x10));
    if ((element_type *)local_2f0._0_8_ != (element_type *)local_2e0) {
      operator_delete((void *)local_2f0._0_8_,(ulong)(local_2e0._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location(&local_208);
    local_3c8.field_2._M_allocated_capacity = local_388.field_2._M_allocated_capacity;
    _Var3._M_p = local_388._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) goto LAB_00377536;
    goto LAB_0037753e;
  case boolean:
    parse_boolean<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case integer:
    parse_integer<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case floating:
    parse_floating<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case string:
    parse_string<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case offset_datetime:
    parse_offset_datetime<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case local_datetime:
    parse_local_datetime<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case local_date:
    parse_local_date<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case local_time:
    parse_local_time<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case array:
    parse_array<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case table:
    parse_inline_table<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  default:
    region::region((region *)local_2f0,loc);
    source_location::source_location(&local_368,(region *)local_2f0);
    region::~region((region *)local_2f0);
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3c8,"toml::parse_value: unknown value appeared","");
    paVar1 = &local_368.file_name_.field_2;
    local_288.file_name_._M_dataplus._M_p = (pointer)&local_288.file_name_.field_2;
    local_288.last_offset_._0_4_ = (undefined4)local_368.last_offset_;
    local_288.last_offset_._4_4_ = local_368.last_offset_._4_4_;
    local_288.length_._0_4_ = (undefined4)local_368.length_;
    local_288.length_._4_4_ = local_368.length_._4_4_;
    local_288.last_line_._0_4_ = (undefined4)local_368.last_line_;
    local_288.last_line_._4_4_ = local_368.last_line_._4_4_;
    local_288.last_column_._0_4_ = (undefined4)local_368.last_column_;
    local_288.last_column_._4_4_ = local_368.last_column_._4_4_;
    local_288.first_column_._0_4_ = (undefined4)local_368.first_column_;
    local_288.first_column_._4_4_ = local_368.first_column_._4_4_;
    local_288.first_offset_._0_4_ = (undefined4)local_368.first_offset_;
    local_288.first_offset_._4_4_ = local_368.first_offset_._4_4_;
    local_288.is_ok_ = local_368.is_ok_;
    local_288._1_7_ = local_368._1_7_;
    local_288.first_line_ = local_368.first_line_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.file_name_._M_dataplus._M_p == paVar1) {
      local_288.file_name_.field_2._8_8_ = local_368.file_name_.field_2._8_8_;
    }
    else {
      local_288.file_name_._M_dataplus._M_p = local_368.file_name_._M_dataplus._M_p;
    }
    local_288.file_name_._M_string_length = local_368.file_name_._M_string_length;
    local_368.file_name_._M_string_length = 0;
    local_368.file_name_.field_2._M_local_buf[0] = '\0';
    local_288.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_368.line_str_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_288.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_368.line_str_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_288.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_368.line_str_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_368.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    local_368.file_name_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"here","");
    make_error_info<>((error_info *)local_2f0,&local_3c8,&local_288,&local_3e8);
    err<toml::error_info>(&local_d8,(error_info *)local_2f0);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_d8);
    failure<toml::error_info>::~failure(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_p != local_2a8) {
      operator_delete(local_2b8._M_p,local_2a8[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_2e0 + 0x10));
    if ((element_type *)local_2f0._0_8_ != (element_type *)local_2e0) {
      operator_delete((void *)local_2f0._0_8_,(ulong)(local_2e0._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location(&local_288);
    _Var3._M_p = local_3c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
LAB_00377536:
      operator_delete(_Var3._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
LAB_0037753e:
    source_location::~source_location(&local_368);
  }
LAB_00377040:
  if (local_190.is_ok_ == false) {
    failure<toml::error_info>::~failure((failure<toml::error_info> *)&local_190.field_1.succ_);
  }
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_value(location& loc, context<TC>& ctx)
{
    const auto ty_res = guess_value_type(loc, ctx);
    if(ty_res.is_err())
    {
        return err(ty_res.unwrap_err());
    }

    switch(ty_res.unwrap())
    {
        case value_t::empty:
        {
            if(ctx.toml_spec().ext_null_value)
            {
                return parse_null(loc, ctx);
            }
            else
            {
                auto src = source_location(region(loc));
                return err(make_error_info("toml::parse_value: unknown value appeared",
                            std::move(src), "here"));
            }
        }
        case value_t::boolean        : {return parse_boolean        (loc, ctx);}
        case value_t::integer        : {return parse_integer        (loc, ctx);}
        case value_t::floating       : {return parse_floating       (loc, ctx);}
        case value_t::string         : {return parse_string         (loc, ctx);}
        case value_t::offset_datetime: {return parse_offset_datetime(loc, ctx);}
        case value_t::local_datetime : {return parse_local_datetime (loc, ctx);}
        case value_t::local_date     : {return parse_local_date     (loc, ctx);}
        case value_t::local_time     : {return parse_local_time     (loc, ctx);}
        case value_t::array          : {return parse_array          (loc, ctx);}
        case value_t::table          : {return parse_inline_table   (loc, ctx);}
        default:
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_value: unknown value appeared",
                        std::move(src), "here"));
        }
    }
}